

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void accumu_costs_iv_adf(warm_cb *data,multi_learner *base,example *ec)

{
  pointer pfVar1;
  uint32_t uVar2;
  uint32_t i;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < data->choices_lambda; uVar3 = uVar3 + 1) {
    uVar2 = predict_sublearner_adf(data,base,ec,(uint32_t)uVar3);
    if (uVar2 == (data->cl_adf).action) {
      pfVar1 = (data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1[uVar3] = (data->cl_adf).cost / (data->cl_adf).probability + pfVar1[uVar3];
    }
  }
  return;
}

Assistant:

void accumu_costs_iv_adf(warm_cb& data, multi_learner& base, example& ec)
{
	CB::cb_class& cl = data.cl_adf;
	//IPS for approximating the cumulative costs for all lambdas
	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		uint32_t action = predict_sublearner_adf(data, base, ec, i);

		if (action == cl.action)
			data.cumulative_costs[i] += cl.cost / cl.probability;
	}
}